

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_isNotBaseUnitImportedTwice_Test::~Units_isNotBaseUnitImportedTwice_Test
          (Units_isNotBaseUnitImportedTwice_Test *this)

{
  Units_isNotBaseUnitImportedTwice_Test *this_local;
  
  ~Units_isNotBaseUnitImportedTwice_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, isNotBaseUnitImportedTwice)
{
    libcellml::ModelPtr m_i1 = libcellml::Model::create();
    m_i1->setName("m_i1");
    libcellml::ModelPtr m_i2 = libcellml::Model::create();
    m_i2->setName("m_i2");

    libcellml::UnitsPtr u_i1 = libcellml::Units::create();
    libcellml::UnitsPtr u_i2 = libcellml::Units::create();
    libcellml::UnitsPtr u_i0 = libcellml::Units::create();

    u_i2->setName("u_i2");
    u_i2->addUnit(libcellml::Units::StandardUnit::AMPERE, 0, 1.0, 1.0);
    u_i1->setName("u_i1");
    u_i0->setName("some_other_u");

    m_i1->addUnits(u_i1);
    m_i2->addUnits(u_i2);

    libcellml::ImportSourcePtr i2 = libcellml::ImportSource::create();
    i2->setUrl("I_am_a_url");
    i2->setModel(m_i2);
    u_i1->setImportSource(i2);
    u_i1->setImportReference("u_i2");

    libcellml::ImportSourcePtr i1 = libcellml::ImportSource::create();
    i1->setUrl("I_am_another_url");
    i1->setModel(m_i1);
    u_i0->setImportSource(i1);
    u_i0->setImportReference("u_i1");

    EXPECT_TRUE(u_i0->isImport());
    EXPECT_TRUE(u_i1->isImport());
    EXPECT_FALSE(u_i2->isImport());
    EXPECT_FALSE(u_i0->isBaseUnit());
}